

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O0

int Abc_NodeStrashBlifMv(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  char cVar1;
  void *pvVar2;
  void *pvVar3;
  Abc_Aig_t *pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *__ptr;
  Abc_Obj_t *pAVar10;
  Abc_Ntk_t *pAVar11;
  char *pcVar12;
  Abc_Obj_t **ppAVar13;
  int nValuesF2;
  int nValuesF;
  int nValues;
  int Index;
  int DefIndex;
  int Def;
  int v;
  int k;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pFanin2;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pTemp2;
  Abc_Obj_t *pTemp;
  Abc_Obj_t **pValuesF2;
  Abc_Obj_t **pValuesF;
  Abc_Obj_t **pValues;
  char *pSop;
  Abc_Obj_t *pAStack_20;
  int fAddFreeVars;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtkNew_local;
  
  pSop._4_4_ = 1;
  pAStack_20 = pObj;
  pObj_local = (Abc_Obj_t *)pNtkNew;
  iVar5 = Abc_ObjIsNode(pObj);
  if (iVar5 == 0) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                  ,0x98,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pAVar9 = Abc_ObjFanout0(pAStack_20);
  iVar5 = Abc_ObjMvVarNum(pAVar9);
  __ptr = (Abc_Obj_t *)malloc((long)iVar5 << 3);
  for (Def = 0; Def < iVar5; Def = Def + 1) {
    pAVar10 = Abc_AigConst1((Abc_Ntk_t *)pObj_local);
    pAVar11 = (Abc_Ntk_t *)Abc_ObjNot(pAVar10);
    (&__ptr->pNtk)[Def] = pAVar11;
  }
  pValues = (Abc_Obj_t **)(pAStack_20->field_5).pData;
  iVar6 = Abc_ObjFaninNum(pAStack_20);
  if (iVar6 == 0) {
    if (*(char *)pValues == 'd') {
      do {
        ppAVar13 = (Abc_Obj_t **)((long)pValues + 1);
        cVar1 = *(char *)pValues;
        pValues = ppAVar13;
      } while (cVar1 != '\n');
    }
    if (*(char *)pValues == ' ') {
      pValues = (Abc_Obj_t **)((long)pValues + 1);
    }
    if (*(char *)pValues == '-') {
      nValuesF = 0;
    }
    else {
      nValuesF = Abc_StringGetNumber((char **)&pValues);
    }
    if (iVar5 <= nValuesF) {
      __assert_fail("Index < nValues",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                    ,0xb2,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    if (((pSop._4_4_ == 0) || (iVar5 != 2)) || (*(char *)pValues != '-')) {
      pAVar11 = (Abc_Ntk_t *)Abc_AigConst1((Abc_Ntk_t *)pObj_local);
      (&__ptr->pNtk)[nValuesF] = pAVar11;
    }
    else {
      pAVar10 = Abc_NtkCreatePi((Abc_Ntk_t *)pObj_local);
      __ptr->pNext = pAVar10;
      pAVar11 = (Abc_Ntk_t *)Abc_ObjNot(__ptr->pNext);
      __ptr->pNtk = pAVar11;
      pAVar10 = __ptr->pNext;
      pcVar12 = Abc_ObjName(__ptr->pNext);
      Abc_ObjAssignName(pAVar10,"free_var_",pcVar12);
    }
    (pAVar9->field_6).pCopy = __ptr;
  }
  else {
    nValues = -1;
    Index = -1;
    if (*(char *)pValues == 'd') {
      ppAVar13 = (Abc_Obj_t **)((long)pValues + 1);
      if (*(char *)ppAVar13 == '=') {
        pValues = (Abc_Obj_t **)((long)pValues + 2);
        nValues = Abc_StringGetNumber((char **)&pValues);
        iVar6 = Abc_ObjFaninNum(pAStack_20);
        if (iVar6 <= nValues) {
          __assert_fail("DefIndex < Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0xcc,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
      }
      else if (*(char *)ppAVar13 == '-') {
        pValues = (Abc_Obj_t **)((long)pValues + 2);
        Index = 0;
      }
      else {
        pValues = ppAVar13;
        Index = Abc_StringGetNumber((char **)&pValues);
        if (iVar5 <= Index) {
          __assert_fail("Def < nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0xd6,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
      }
      if (*(char *)pValues != '\n') {
        __assert_fail("*pSop == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0xd8,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      pValues = (Abc_Obj_t **)((long)pValues + 1);
    }
    for (; *(char *)pValues != '\0'; pValues = (Abc_Obj_t **)((long)pValues + 1)) {
      pTemp2 = Abc_AigConst1((Abc_Ntk_t *)pObj_local);
      for (Def = 0; iVar6 = Abc_ObjFaninNum(pAStack_20), Def < iVar6; Def = Def + 1) {
        pAVar10 = Abc_ObjFanin(pAStack_20,Def);
        if (*(char *)pValues == '-') {
          pValues = (Abc_Obj_t **)((long)pValues + 2);
        }
        else {
          if (*(char *)pValues == '!') {
            if (__ptr != (Abc_Obj_t *)0x0) {
              free(__ptr);
            }
            pAVar9 = Abc_ObjFanout0(pAStack_20);
            pcVar12 = Abc_ObjName(pAVar9);
            printf("Abc_NodeStrashBlifMv(): Cannot handle complement in the MV function of node %s.\n"
                   ,pcVar12);
            return 0;
          }
          if (*(char *)pValues == '{') {
            if (__ptr != (Abc_Obj_t *)0x0) {
              free(__ptr);
            }
            pAVar9 = Abc_ObjFanout0(pAStack_20);
            pcVar12 = Abc_ObjName(pAVar9);
            printf("Abc_NodeStrashBlifMv(): Cannot handle braces in the MV function of node %s.\n",
                   pcVar12);
            return 0;
          }
          iVar6 = Abc_ObjMvVarNum(pAVar10);
          pvVar3 = (pAVar10->field_6).pTemp;
          if (*(char *)pValues == '(') {
            pValues = (Abc_Obj_t **)((long)pValues + 1);
            pAVar10 = Abc_AigConst1((Abc_Ntk_t *)pObj_local);
            pFanin = Abc_ObjNot(pAVar10);
            while (*(char *)pValues != ')') {
              iVar8 = Abc_StringGetNumber((char **)&pValues);
              if (iVar6 <= iVar8) {
                __assert_fail("Index < nValuesF",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0xfe,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              pFanin = Abc_AigOr(*(Abc_Aig_t **)&pObj_local[3].vFanouts,pFanin,
                                 *(Abc_Obj_t **)((long)pvVar3 + (long)iVar8 * 8));
              if ((*(char *)pValues != ')') && (*(char *)pValues != ',')) {
                __assert_fail("*pSop == \')\' || *pSop == \',\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                              ,0x100,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
              }
              if (*(char *)pValues == ',') {
                pValues = (Abc_Obj_t **)((long)pValues + 1);
              }
            }
            if (*(char *)pValues != ')') {
              __assert_fail("*pSop == \')\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x104,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            pValues = (Abc_Obj_t **)((long)pValues + 1);
          }
          else if (*(char *)pValues == '=') {
            pValues = (Abc_Obj_t **)((long)pValues + 1);
            iVar8 = Abc_StringGetNumber((char **)&pValues);
            iVar7 = Abc_ObjFaninNum(pAStack_20);
            if (iVar7 <= iVar8) {
              __assert_fail("Index < Abc_ObjFaninNum(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x10c,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            if (iVar8 == Def) {
              __assert_fail("Index != k",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x10d,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            pAVar10 = Abc_ObjFanin(pAStack_20,iVar8);
            iVar8 = Abc_ObjMvVarNum(pAVar10);
            pvVar2 = (pAVar10->field_6).pTemp;
            if (iVar6 != iVar8) {
              __assert_fail("nValuesF == nValuesF2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x113,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            pAVar10 = Abc_AigConst1((Abc_Ntk_t *)pObj_local);
            pFanin = Abc_ObjNot(pAVar10);
            for (DefIndex = 0; DefIndex < iVar5; DefIndex = DefIndex + 1) {
              pAVar4 = *(Abc_Aig_t **)&pObj_local[3].vFanouts;
              pAVar10 = Abc_AigAnd(*(Abc_Aig_t **)&pObj_local[3].vFanouts,
                                   *(Abc_Obj_t **)((long)pvVar3 + (long)DefIndex * 8),
                                   *(Abc_Obj_t **)((long)pvVar2 + (long)DefIndex * 8));
              pFanin = Abc_AigOr(pAVar4,pFanin,pAVar10);
            }
          }
          else {
            iVar8 = Abc_StringGetNumber((char **)&pValues);
            if (iVar6 <= iVar8) {
              __assert_fail("Index < nValuesF",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                            ,0x11b,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
            }
            pFanin = *(Abc_Obj_t **)((long)pvVar3 + (long)iVar8 * 8);
          }
          pTemp2 = Abc_AigAnd(*(Abc_Aig_t **)&pObj_local[3].vFanouts,pTemp2,pFanin);
          if (*(char *)pValues != ' ') {
            __assert_fail("*pSop == \' \'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                          ,0x121,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
          }
          pValues = (Abc_Obj_t **)((long)pValues + 1);
        }
      }
      if (*(char *)pValues == '=') {
        pValues = (Abc_Obj_t **)((long)pValues + 1);
        iVar6 = Abc_StringGetNumber((char **)&pValues);
        iVar8 = Abc_ObjFaninNum(pAStack_20);
        if (iVar8 <= iVar6) {
          __assert_fail("Index < Abc_ObjFaninNum(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x12a,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar10 = Abc_ObjFanin(pAStack_20,iVar6);
        iVar6 = Abc_ObjMvVarNum(pAVar10);
        pvVar3 = (pAVar10->field_6).pTemp;
        if (iVar6 != iVar5) {
          __assert_fail("nValuesF == nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x12f,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        for (Def = 0; Def < iVar6; Def = Def + 1) {
          pAVar4 = *(Abc_Aig_t **)&pObj_local[3].vFanouts;
          pAVar11 = (&__ptr->pNtk)[Def];
          pAVar10 = Abc_AigAnd(*(Abc_Aig_t **)&pObj_local[3].vFanouts,pTemp2,
                               *(Abc_Obj_t **)((long)pvVar3 + (long)Def * 8));
          pAVar11 = (Abc_Ntk_t *)Abc_AigOr(pAVar4,(Abc_Obj_t *)pAVar11,pAVar10);
          (&__ptr->pNtk)[Def] = pAVar11;
        }
      }
      else {
        iVar6 = Abc_StringGetNumber((char **)&pValues);
        if (iVar5 <= iVar6) {
          __assert_fail("Index < nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x137,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar11 = (Abc_Ntk_t *)
                  Abc_AigOr(*(Abc_Aig_t **)&pObj_local[3].vFanouts,
                            (Abc_Obj_t *)(&__ptr->pNtk)[iVar6],pTemp2);
        (&__ptr->pNtk)[iVar6] = pAVar11;
      }
      if (*(char *)pValues != '\n') {
        __assert_fail("*pSop == \'\\n\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                      ,0x13b,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
      }
    }
    if ((-1 < Index) || (-1 < nValues)) {
      pTemp2 = Abc_AigConst1((Abc_Ntk_t *)pObj_local);
      for (Def = 0; Def < iVar5; Def = Def + 1) {
        if (Def != Index) {
          pAVar4 = *(Abc_Aig_t **)&pObj_local[3].vFanouts;
          pAVar10 = Abc_ObjNot((Abc_Obj_t *)(&__ptr->pNtk)[Def]);
          pTemp2 = Abc_AigAnd(pAVar4,pTemp2,pAVar10);
        }
      }
      if (Index < 0) {
        if (nValues < 0) {
          __assert_fail("DefIndex >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x14f,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        pAVar10 = Abc_ObjFanin(pAStack_20,nValues);
        iVar6 = Abc_ObjMvVarNum(pAVar10);
        pvVar3 = (pAVar10->field_6).pTemp;
        if (iVar6 != iVar5) {
          __assert_fail("nValuesF == nValues",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                        ,0x154,"int Abc_NodeStrashBlifMv(Abc_Ntk_t *, Abc_Obj_t *)");
        }
        for (Def = 0; Def < iVar6; Def = Def + 1) {
          pAVar4 = *(Abc_Aig_t **)&pObj_local[3].vFanouts;
          pAVar11 = (&__ptr->pNtk)[Def];
          pAVar10 = Abc_AigAnd(*(Abc_Aig_t **)&pObj_local[3].vFanouts,pTemp2,
                               *(Abc_Obj_t **)((long)pvVar3 + (long)Def * 8));
          pAVar11 = (Abc_Ntk_t *)Abc_AigOr(pAVar4,(Abc_Obj_t *)pAVar11,pAVar10);
          (&__ptr->pNtk)[Def] = pAVar11;
        }
      }
      else {
        (&__ptr->pNtk)[Index] = (Abc_Ntk_t *)pTemp2;
      }
    }
    (pAVar9->field_6).pCopy = __ptr;
  }
  return 1;
}

Assistant:

int Abc_NodeStrashBlifMv( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    int fAddFreeVars = 1;
    char * pSop;
    Abc_Obj_t ** pValues, ** pValuesF, ** pValuesF2;
    Abc_Obj_t * pTemp, * pTemp2, * pFanin, * pFanin2, * pNet;
    int k, v, Def, DefIndex, Index, nValues, nValuesF, nValuesF2;

    // start the output values
    assert( Abc_ObjIsNode(pObj) );
    pNet = Abc_ObjFanout0(pObj);
    nValues = Abc_ObjMvVarNum(pNet);
    pValues = ABC_ALLOC( Abc_Obj_t *, nValues );
    for ( k = 0; k < nValues; k++ )
        pValues[k] = Abc_ObjNot( Abc_AigConst1(pNtkNew) );

    // get the BLIF-MV formula
    pSop = (char *)pObj->pData;
    // skip the value line
//    while ( *pSop++ != '\n' );

    // handle the constant
    if ( Abc_ObjFaninNum(pObj) == 0 )
    {
        // skip the default if present
        if ( *pSop == 'd' )
            while ( *pSop++ != '\n' );
        // skip space if present
        if ( *pSop == ' ' )
            pSop++;
        // assume don't-care constant to be zero
        if ( *pSop == '-' )
            Index = 0;
        else
            Index = Abc_StringGetNumber( &pSop );
        assert( Index < nValues );
        ////////////////////////////////////////////
        // adding free variables for binary ND-constants
        if ( fAddFreeVars && nValues == 2 && *pSop == '-' )
        {
            pValues[1] = Abc_NtkCreatePi(pNtkNew);
            pValues[0] = Abc_ObjNot( pValues[1] );
            Abc_ObjAssignName( pValues[1], "free_var_", Abc_ObjName(pValues[1]) );
        }
        else
            pValues[Index] = Abc_AigConst1(pNtkNew);
        ////////////////////////////////////////////
        // save the values in the fanout net
        pNet->pCopy = (Abc_Obj_t *)pValues;
        return 1;
    }

    // parse the default line
    Def = DefIndex = -1;
    if ( *pSop == 'd' )
    {
        pSop++;
        if ( *pSop == '=' )
        {
            pSop++;
            DefIndex = Abc_StringGetNumber( &pSop );
            assert( DefIndex < Abc_ObjFaninNum(pObj) );
        }
        else if ( *pSop == '-' )
        {
            pSop++;
            Def = 0;
        }
        else
        {
            Def = Abc_StringGetNumber( &pSop );
            assert( Def < nValues );
        }
        assert( *pSop == '\n' );
        pSop++;
    }

    // convert the values
    while ( *pSop )
    {
        // extract the values for each cube
        pTemp = Abc_AigConst1(pNtkNew); 
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( *pSop == '-' )
            {
                pSop += 2;
                continue;
            }
            if ( *pSop == '!' )
            {
                ABC_FREE( pValues );
                printf( "Abc_NodeStrashBlifMv(): Cannot handle complement in the MV function of node %s.\n", Abc_ObjName(Abc_ObjFanout0(pObj)) );
                return 0;
            }
            if ( *pSop == '{' )
            {
                ABC_FREE( pValues );
                printf( "Abc_NodeStrashBlifMv(): Cannot handle braces in the MV function of node %s.\n", Abc_ObjName(Abc_ObjFanout0(pObj)) );
                return 0;
            }
            // get the value set
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            if ( *pSop == '(' )
            {
                pSop++;
                pTemp2 = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                while ( *pSop != ')' )
                {
                    Index = Abc_StringGetNumber( &pSop );
                    assert( Index < nValuesF );
                    pTemp2 = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp2, pValuesF[Index] );
                    assert( *pSop == ')' || *pSop == ',' );
                    if ( *pSop == ',' )
                        pSop++;
                }
                assert( *pSop == ')' );
                pSop++;
            }
            else if ( *pSop == '=' )
            {
                pSop++;
                // get the fanin index
                Index = Abc_StringGetNumber( &pSop );
                assert( Index < Abc_ObjFaninNum(pObj) );
                assert( Index != k );
                // get the fanin
                pFanin2 = Abc_ObjFanin( pObj, Index );
                nValuesF2 = Abc_ObjMvVarNum(pFanin2);
                pValuesF2 = (Abc_Obj_t **)pFanin2->pCopy;
                // create the sum of products of values
                assert( nValuesF == nValuesF2 );
                pTemp2 = Abc_ObjNot( Abc_AigConst1(pNtkNew) );
                for ( v = 0; v < nValues; v++ )
                    pTemp2 = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp2, Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pValuesF[v], pValuesF2[v]) );
            }
            else
            {
                Index = Abc_StringGetNumber( &pSop );
                assert( Index < nValuesF );
                pTemp2 = pValuesF[Index];
            }
            // compute the compute
            pTemp = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pTemp2 );
            // advance the reading point
            assert( *pSop == ' ' );
            pSop++;
        }
        // check if the output value is an equal construct
        if ( *pSop == '=' )
        {
            pSop++;
            // get the output value
            Index = Abc_StringGetNumber( &pSop );
            assert( Index < Abc_ObjFaninNum(pObj) );
            // add values of the given fanin with the given cube
            pFanin = Abc_ObjFanin( pObj, Index );
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            assert( nValuesF == nValues ); // should be guaranteed by the parser
            for ( k = 0; k < nValuesF; k++ )
                pValues[k] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[k], Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pValuesF[k]) );
        }
        else
        {
            // get the output value
            Index = Abc_StringGetNumber( &pSop );
            assert( Index < nValues );
            pValues[Index] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[Index], pTemp );
        }
        // advance the reading point
        assert( *pSop == '\n' );
        pSop++;
    }

    // compute the default value
    if ( Def >= 0 || DefIndex >= 0 )
    {
        pTemp = Abc_AigConst1(pNtkNew);
        for ( k = 0; k < nValues; k++ )
        {
            if ( k == Def )
                continue;
            pTemp = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, pTemp, Abc_ObjNot(pValues[k]) );
        }

        // assign the default value
        if ( Def >= 0 )
            pValues[Def] = pTemp;
        else
        {
            assert( DefIndex >= 0 );
            // add values of the given fanin with the given cube
            pFanin = Abc_ObjFanin( pObj, DefIndex );
            nValuesF = Abc_ObjMvVarNum(pFanin);
            pValuesF = (Abc_Obj_t **)pFanin->pCopy;
            assert( nValuesF == nValues ); // should be guaranteed by the parser
            for ( k = 0; k < nValuesF; k++ )
                pValues[k] = Abc_AigOr( (Abc_Aig_t *)pNtkNew->pManFunc, pValues[k], Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc, pTemp, pValuesF[k]) );
        }

    }

    // save the values in the fanout net
    pNet->pCopy = (Abc_Obj_t *)pValues;
    return 1;
}